

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_OnObjectExpectedButNotCalled_Test::testBody
          (TEST_MockCallTest_OnObjectExpectedButNotCalled_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *test;
  SimpleString local_168;
  SimpleString local_158;
  undefined1 local_148 [8];
  MockExpectedObjectDidntHappenFailure expectedFailure;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  undefined1 local_30 [8];
  MockExpectedCallsListForTest expectations;
  void *objectPtr;
  TEST_MockCallTest_OnObjectExpectedButNotCalled_Test *pTStack_10;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockCallTest_OnObjectExpectedButNotCalled_Test *this_local;
  
  pTStack_10 = this;
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&objectPtr + 7));
  expectations.super_MockExpectedCallsList.head_ = (MockExpectedCallsListNode *)0x1;
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_30);
  SimpleString::SimpleString(local_50,"boo");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)local_30,local_50);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0x24])
            (pMVar2,expectations.super_MockExpectedCallsList.head_);
  SimpleString::~SimpleString(local_50);
  SimpleString::SimpleString(&local_60,"boo");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)local_30,&local_60);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0x24])
            (pMVar2,expectations.super_MockExpectedCallsList.head_);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_70,"");
  pMVar3 = mock(&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"boo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_80);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x120))
            ((long *)CONCAT44(extraout_var,iVar1),expectations.super_MockExpectedCallsList.head_);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::SimpleString(&local_90,"");
  pMVar3 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"boo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_a0);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x120))
            ((long *)CONCAT44(extraout_var_00,iVar1),expectations.super_MockExpectedCallsList.head_)
  ;
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::SimpleString(&local_b0,"");
  pMVar3 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c0,"boo");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_c0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_d0,"");
  pMVar3 = mock(&local_d0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"boo");
  (*pMVar3->_vptr_MockSupport[6])
            (pMVar3,&expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString(&local_d0);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_158,"boo");
  MockExpectedObjectDidntHappenFailure::MockExpectedObjectDidntHappenFailure
            ((MockExpectedObjectDidntHappenFailure *)local_148,test,&local_158,
             (MockExpectedCallsList *)local_30);
  SimpleString::~SimpleString(&local_158);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x1af);
  SimpleString::SimpleString(&local_168,"");
  pMVar3 = mock(&local_168,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_168);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x1b1);
  MockExpectedObjectDidntHappenFailure::~MockExpectedObjectDidntHappenFailure
            ((MockExpectedObjectDidntHappenFailure *)local_148);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_30);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&objectPtr + 7));
  return;
}

Assistant:

TEST(MockCallTest, OnObjectExpectedButNotCalled)
{
    MockFailureReporterInstaller failureReporterInstaller;

    void* objectPtr = (void*) 0x001;
    MockExpectedCallsListForTest expectations;
    expectations.addFunction("boo")->onObject(objectPtr);
    expectations.addFunction("boo")->onObject(objectPtr);

    mock().expectOneCall("boo").onObject(objectPtr);
    mock().expectOneCall("boo").onObject(objectPtr);
    mock().actualCall("boo");
    mock().actualCall("boo");

    MockExpectedObjectDidntHappenFailure expectedFailure(mockFailureTest(), "boo", expectations);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}